

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureUploadTests.cpp
# Opt level: O0

void __thiscall deqp::gles2::Performance::TextureUploadCase::deinit(TextureUploadCase *this)

{
  ShaderProgram *this_00;
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  TextureUploadCase *this_local;
  
  pRVar2 = gles2::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  if (this->m_program != (ShaderProgram *)0x0) {
    this_00 = this->m_program;
    if (this_00 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(this_00);
      operator_delete(this_00,0xd0);
    }
    this->m_program = (ShaderProgram *)0x0;
  }
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x480))(1,&this->m_texture);
  this->m_texture = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->m_texData);
  return;
}

Assistant:

void TextureUploadCase::deinit (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_program)
	{
		delete m_program;
		m_program = DE_NULL;
	}

	gl.deleteTextures(1, &m_texture);
	m_texture = 0;

	m_texData.clear();
}